

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

void __thiscall
spvtools::opt::Module::ToBinary
          (Module *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *binary,bool skip_nop)

{
  pointer puVar1;
  undefined7 in_register_00000011;
  bool between_label_and_phi_var;
  bool between_merge_and_branch;
  undefined4 local_74;
  pointer local_70;
  uint32_t *local_68;
  Instruction *last_line_inst;
  DebugScope last_scope;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_74 = (undefined4)CONCAT71(in_register_00000011,skip_nop);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (binary,(value_type_conflict1 *)this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (binary,&(this->header_).version);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (binary,&(this->header_).generator);
  local_68 = &(this->header_).bound;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(binary,local_68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (binary,&(this->header_).schema);
  local_70 = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  puVar1 = (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  last_scope.lexical_scope_ = 0;
  last_scope.inlined_at_ = 0;
  last_line_inst = (Instruction *)0x0;
  between_merge_and_branch = false;
  between_label_and_phi_var = false;
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = ::operator_new(0x38);
  *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)local_50._M_unused._0_8_ = binary;
  *(code *)((long)local_50._M_unused._0_8_ + 8) = SUB41(local_74,0);
  *(DebugScope **)((long)local_50._M_unused._0_8_ + 0x10) = &last_scope;
  *(Instruction ***)((long)local_50._M_unused._0_8_ + 0x18) = &last_line_inst;
  *(bool **)((long)local_50._M_unused._0_8_ + 0x20) = &between_merge_and_branch;
  *(bool **)((long)local_50._M_unused._0_8_ + 0x28) = &between_label_and_phi_var;
  *(Module **)((long)local_50._M_unused._0_8_ + 0x30) = this;
  local_38 = std::
             _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/module.cpp:154:21)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/module.cpp:154:21)>
             ::_M_manager;
  ForEachInst(this,(function<void_(const_spvtools::opt::Instruction_*)> *)&local_50,true);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  *(uint32_t *)
   ((long)puVar1 +
   (long)(binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start + (-8 - (long)local_70)) = *local_68;
  return;
}

Assistant:

void Module::ToBinary(std::vector<uint32_t>* binary, bool skip_nop) const {
  binary->push_back(header_.magic_number);
  binary->push_back(header_.version);
  // TODO(antiagainst): should we change the generator number?
  binary->push_back(header_.generator);
  binary->push_back(header_.bound);
  binary->push_back(header_.schema);

  size_t bound_idx = binary->size() - 2;
  DebugScope last_scope(kNoDebugScope, kNoInlinedAt);
  const Instruction* last_line_inst = nullptr;
  bool between_merge_and_branch = false;
  bool between_label_and_phi_var = false;
  auto write_inst = [binary, skip_nop, &last_scope, &last_line_inst,
                     &between_merge_and_branch, &between_label_and_phi_var,
                     this](const Instruction* i) {
    // Skip emitting line instructions between merge and branch instructions.
    auto opcode = i->opcode();
    if (between_merge_and_branch && i->IsLineInst()) {
      return;
    }
    if (last_line_inst != nullptr) {
      // If the current instruction is OpLine or DebugLine and it is the same
      // as the last line instruction that is still effective (can be applied
      // to the next instruction), we skip writing the current instruction.
      if (i->IsLine()) {
        uint32_t operand_index = 0;
        if (last_line_inst->WhileEachInOperand(
                [&operand_index, i](const uint32_t* word) {
                  assert(i->NumInOperandWords() > operand_index);
                  return *word == i->GetSingleWordInOperand(operand_index++);
                })) {
          return;
        }
      } else if (!i->IsNoLine() && i->dbg_line_insts().empty()) {
        // If the current instruction does not have the line information,
        // the last line information is not effective any more. Emit OpNoLine
        // or DebugNoLine to specify it.
        uint32_t shader_set_id = context()
                                     ->get_feature_mgr()
                                     ->GetExtInstImportId_Shader100DebugInfo();
        if (shader_set_id != 0) {
          binary->push_back((5 << 16) |
                            static_cast<uint16_t>(spv::Op::OpExtInst));
          binary->push_back(context()->get_type_mgr()->GetVoidTypeId());
          binary->push_back(context()->TakeNextId());
          binary->push_back(shader_set_id);
          binary->push_back(NonSemanticShaderDebugInfo100DebugNoLine);
        } else {
          binary->push_back((1 << 16) |
                            static_cast<uint16_t>(spv::Op::OpNoLine));
        }
        last_line_inst = nullptr;
      }
    }

    if (opcode == spv::Op::OpLabel) {
      between_label_and_phi_var = true;
    } else if (opcode != spv::Op::OpVariable && opcode != spv::Op::OpPhi &&
               !spvtools::opt::IsOpLineInst(opcode)) {
      between_label_and_phi_var = false;
    }

    if (!(skip_nop && i->IsNop())) {
      const auto& scope = i->GetDebugScope();
      if (scope != last_scope && !between_merge_and_branch) {
        // Can only emit nonsemantic instructions after all phi instructions
        // in a block so don't emit scope instructions before phi instructions
        // for NonSemantic.Shader.DebugInfo.100.
        if (!between_label_and_phi_var ||
            context()
                ->get_feature_mgr()
                ->GetExtInstImportId_OpenCL100DebugInfo()) {
          // Emit DebugScope |scope| to |binary|.
          auto dbg_inst = ext_inst_debuginfo_.begin();
          scope.ToBinary(dbg_inst->type_id(), context()->TakeNextId(),
                         dbg_inst->GetSingleWordOperand(2), binary);
        }
        last_scope = scope;
      }

      i->ToBinaryWithoutAttachedDebugInsts(binary);
    }
    // Update the last line instruction.
    between_merge_and_branch = false;
    if (spvOpcodeIsBlockTerminator(opcode) || i->IsNoLine()) {
      last_line_inst = nullptr;
    } else if (opcode == spv::Op::OpLoopMerge ||
               opcode == spv::Op::OpSelectionMerge) {
      between_merge_and_branch = true;
      last_line_inst = nullptr;
    } else if (i->IsLine()) {
      last_line_inst = i;
    }
  };
  ForEachInst(write_inst, true);

  // We create new instructions for DebugScope and DebugNoLine. The bound must
  // be updated.
  binary->data()[bound_idx] = header_.bound;
}